

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand.h
# Opt level: O1

string * __thiscall hand::printHidden_abi_cxx11_(string *__return_storage_ptr__,hand *this)

{
  pointer pcVar1;
  pointer pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar2 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                super__Vector_impl_data._M_start; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string hand::printHidden() {
    string output;
    for (auto &card : hand_) output += "[?] ";
    return output;
}